

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Psbt::GetPsbtVersion(Psbt *this)

{
  CfdException *this_00;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  void *local_18;
  wally_psbt *psbt_pointer;
  Psbt *this_local;
  
  local_18 = this->wally_psbt_pointer_;
  if (local_18 == (void *)0x0) {
    psbt_pointer = (wally_psbt *)this;
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0xc50;
    local_30.funcname = "GetPsbtVersion";
    logger::warn<>(&local_30,"psbt pointer is null");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_50,"psbt pointer is null.",&local_51);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_50);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return *(uint32_t *)((long)local_18 + 0x58);
}

Assistant:

uint32_t Psbt::GetPsbtVersion() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }
  return psbt_pointer->version;
}